

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O3

vocwdef * vocffw(voccxdef *ctx,char *wrd,int len,char *wrd2,int len2,int p,vocseadef *search_ctx)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  vocwdef *pvVar4;
  vocdef *pvVar5;
  uint uVar6;
  long lVar7;
  
  uVar3 = vochsh((uchar *)wrd,len);
  pvVar5 = ctx->voccxhsh[uVar3];
  do {
    if (pvVar5 == (vocdef *)0x0) {
      pvVar5 = (vocdef *)0x0;
      pvVar4 = (vocwdef *)0x0;
LAB_001f0d01:
      if (search_ctx != (vocseadef *)0x0) {
        search_ctx->v = pvVar5;
        search_ctx->vw = pvVar4;
        search_ctx->wrd1 = (uchar *)wrd;
        search_ctx->len1 = len;
        search_ctx->wrd2 = (uchar *)wrd2;
        search_ctx->len2 = len2;
      }
      return pvVar4;
    }
    bVar1 = pvVar5->voclen;
    if (bVar1 == 0 && len == 0) {
LAB_001f0c35:
      bVar2 = pvVar5->vocln2;
      if (bVar2 == 0 && len2 == 0) {
LAB_001f0c83:
        uVar6 = pvVar5->vocwlst;
        if ((uVar6 != 0xffffffff) && (ctx->voccxwp[(ulong)uVar6 / 2000] != (vocwdef *)0x0)) {
          pvVar4 = ctx->voccxwp[(ulong)uVar6 / 2000] + uVar6 % 2000;
          do {
            if (((uint)pvVar4->vocwtyp == p) && ((pvVar4->vocwflg & 9) == 0)) goto LAB_001f0d01;
            uVar6 = pvVar4->vocwnxt;
          } while ((uVar6 != 0xffffffff) &&
                  (pvVar4 = ctx->voccxwp[(ulong)uVar6 / 2000] + uVar6 % 2000,
                  ctx->voccxwp[(ulong)uVar6 / 2000] != (vocwdef *)0x0));
        }
      }
      else if ((len2 != 0) && (bVar2 != 0)) {
        uVar6 = len2;
        if ((uint)bVar2 < (uint)len2) {
          uVar6 = (uint)bVar2;
        }
        if ((uint)len2 < 6) {
          uVar6 = (uint)bVar2;
        }
        if (uVar6 == len2) {
          lVar7 = 0;
          do {
            if (wrd2[lVar7] != pvVar5->voctxt[lVar7 + (ulong)bVar1]) goto LAB_001f0cf1;
            lVar7 = lVar7 + 1;
          } while (len2 != (int)lVar7);
          goto LAB_001f0c83;
        }
      }
    }
    else if ((len != 0) && (bVar1 != 0)) {
      uVar6 = len;
      if ((uint)bVar1 < (uint)len) {
        uVar6 = (uint)bVar1;
      }
      if ((uint)len < 6) {
        uVar6 = (uint)bVar1;
      }
      if (uVar6 == len) {
        lVar7 = 0;
        do {
          if (wrd[lVar7] != pvVar5->voctxt[lVar7]) goto LAB_001f0cf1;
          lVar7 = lVar7 + 1;
        } while (len != (int)lVar7);
        goto LAB_001f0c35;
      }
    }
LAB_001f0cf1:
    pvVar5 = pvVar5->vocnxt;
  } while( true );
}

Assistant:

vocwdef *vocffw(voccxdef *ctx, char *wrd, int len, char *wrd2, int len2,
                int p, vocseadef *search_ctx)
{
    uint     hshval;
    vocdef  *v, *vf;
    vocwdef *vw, *vwf;

    /* get the word's hash value */
    hshval = vochsh((uchar *)wrd, len);

    /* scan the hash list until we run out of entries, or find a match */
    for (v = ctx->voccxhsh[hshval], vf = 0 ; v != 0 && vf == 0 ;
         v = v->vocnxt)
    {
        /* if this word matches, look at the objects in its list */
        if (voceq((uchar *)wrd, len, v->voctxt, v->voclen)
            && voceq((uchar *)wrd2, len2, v->voctxt + v->voclen, v->vocln2))
        {
            /* look for a suitable object in the vocwdef list */
            for (vw = vocwget(ctx, v->vocwlst) ; vw ;
                 vw = vocwget(ctx, vw->vocwnxt))
            {
                if (vw->vocwtyp == p && !(vw->vocwflg & VOCFCLASS)
                    && !(vw->vocwflg & VOCFDEL))
                {
                    /*
                     *   remember the first vocdef that we found, and
                     *   remember this, the first matching vocwdef; then
                     *   stop scanning, since we have a match 
                     */
                    vf = v;
                    vwf = vw;
                    break;
                }
            }
        }
    }

    /* set up the caller-provided search structure for next time */
    vw = (vf != 0 ? vwf : 0);
    if (search_ctx)
    {
        /* save the search position */
        search_ctx->v = vf;
        search_ctx->vw = vw;

        /* save the search criteria */
        search_ctx->wrd1 = (uchar *)wrd;
        search_ctx->len1 = len;
        search_ctx->wrd2 = (uchar *)wrd2;
        search_ctx->len2 = len2;
    }

    /* return the match */
    return vw;
}